

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFormatTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::Texture2DFormatCase::init(Texture2DFormatCase *this,EVP_PKEY_CTX *ctx)

{
  TestLog *pTVar1;
  int iVar2;
  ostream *stream;
  Texture2D *this_00;
  TextureFormat fmt;
  TextureFormatInfo spec;
  ostringstream fmtName;
  Enum<int,_2UL> local_390;
  long local_380 [2];
  TextureFormat local_370;
  LogGradientFmt local_368;
  TextureFormatInfo local_358;
  ostringstream local_318 [112];
  ios_base local_2a8 [264];
  undefined1 local_1a0 [8];
  deUint32 local_198;
  ios_base local_128 [264];
  
  pTVar1 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_370 = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  tcu::getTextureFormatInfo(&local_358,&local_370);
  std::__cxx11::ostringstream::ostringstream(local_318);
  local_198 = this->m_format;
  local_1a0 = (undefined1  [8])glu::getTextureFormatName;
  stream = tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_1a0,(ostream *)local_318);
  std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
  local_390.m_value = this->m_dataType;
  local_390.m_getName = glu::getTypeName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_390,stream);
  local_1a0 = (undefined1  [8])pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"2D texture, ",0xc);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,(char *)local_390.m_getName,
             CONCAT44(local_390._12_4_,local_390.m_value));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,", ",2);
  std::ostream::operator<<((ostringstream *)&local_198,this->m_width);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"x",1);
  std::ostream::operator<<((ostringstream *)&local_198,this->m_height);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,",\n  fill with ",0xe);
  local_368.valueMin = &local_358.valueMin;
  local_368.valueMax = &local_358.valueMax;
  glu::TextureTestUtil::operator<<((ostream *)&local_198,&local_368);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198," gradient",9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_390.m_getName != (GetNameFunc)local_380) {
    operator_delete(local_390.m_getName,local_380[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  this_00 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (this_00,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,this->m_height)
  ;
  this->m_texture = this_00;
  tcu::Texture2D::allocLevel(&this_00->m_refTexture,0);
  tcu::fillWithComponentGradients
            ((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,&local_358.valueMin,&local_358.valueMax);
  std::__cxx11::ostringstream::~ostringstream(local_318);
  iVar2 = std::ios_base::~ios_base(local_2a8);
  return iVar2;
}

Assistant:

void Texture2DFormatCase::init (void)
{
	TestLog&				log		= m_testCtx.getLog();
	tcu::TextureFormat		fmt		= glu::mapGLTransferFormat(m_format, m_dataType);
	tcu::TextureFormatInfo	spec	= tcu::getTextureFormatInfo(fmt);
	std::ostringstream		fmtName;

	fmtName << getTextureFormatStr(m_format) << ", " << getTypeStr(m_dataType);

	log << TestLog::Message << "2D texture, " << fmtName.str() << ", " << m_width << "x" << m_height
							<< ",\n  fill with " << formatGradient(&spec.valueMin, &spec.valueMax) << " gradient"
		<< TestLog::EndMessage;

	m_texture = new Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height);

	// Fill level 0.
	m_texture->getRefTexture().allocLevel(0);
	tcu::fillWithComponentGradients(m_texture->getRefTexture().getLevel(0), spec.valueMin, spec.valueMax);
}